

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O2

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uStack_20;
  uv_lib_t local_18;
  
  local_18.handle = (void *)0x0;
  local_18.errmsg = (char *)0x0;
  pcVar2 = uv_dlerror(&local_18);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "msg != NULL";
    uStack_20 = 0x25;
  }
  else {
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "strstr(msg, dlerror_no_error) != NULL";
      uStack_20 = 0x26;
    }
    else {
      iVar1 = uv_dlopen("test/fixtures/load_error.node",&local_18);
      if (iVar1 == -1) {
        pcVar2 = uv_dlerror(&local_18);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "msg != NULL";
          uStack_20 = 0x2c;
        }
        else {
          pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
          if (pcVar3 == (char *)0x0) {
            pcVar2 = "strstr(msg, path) != NULL";
            uStack_20 = 0x2e;
          }
          else {
            pcVar2 = strstr(pcVar2,"no error");
            if (pcVar2 == (char *)0x0) {
              pcVar2 = uv_dlerror(&local_18);
              if (pcVar2 == (char *)0x0) {
                pcVar2 = "msg != NULL";
                uStack_20 = 0x34;
              }
              else {
                pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
                if (pcVar3 == (char *)0x0) {
                  pcVar2 = "strstr(msg, path) != NULL";
                  uStack_20 = 0x36;
                }
                else {
                  pcVar2 = strstr(pcVar2,"no error");
                  if (pcVar2 == (char *)0x0) {
                    uv_dlclose(&local_18);
                    return 0;
                  }
                  pcVar2 = "strstr(msg, dlerror_no_error) == NULL";
                  uStack_20 = 0x38;
                }
              }
            }
            else {
              pcVar2 = "strstr(msg, dlerror_no_error) == NULL";
              uStack_20 = 0x30;
            }
          }
        }
      }
      else {
        pcVar2 = "r == -1";
        uStack_20 = 0x29;
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
  ASSERT(strstr(msg, dlerror_no_error) != NULL);

  r = uv_dlopen(path, &lib);
  ASSERT(r == -1);

  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  uv_dlclose(&lib);

  return 0;
}